

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O2

double Tools::NormalizeAngle(double a,int debug)

{
  ostream *poVar1;
  int iVar2;
  
  iVar2 = 0;
  for (; 3.141592653589793 < a; a = a + -6.283185307179586) {
    iVar2 = iVar2 + -1;
  }
  for (; a < -3.141592653589793; a = a + 6.283185307179586) {
    iVar2 = iVar2 + -1;
  }
  if (debug != 0 && iVar2 != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"normalize operations: ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,-iVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return a;
}

Assistant:

double Tools::NormalizeAngle(double a, int debug) {
#if defined(NORM_ANGLE_LOOP)
    int n = 0;
    while (a > M_PI)  {a -= Tools::PI2; n++;}
    while (a < -M_PI) {a += Tools::PI2; n++;}
    if (n>0 && debug)
        std::cout << "normalize operations: " << n  << std::endl; 
    return a;
#elif defined(NORM_ANGLE_CEIL)
    return a - ceil((a-M_PI)/(Tools::PI2))*Tools::PI2;
#else
    return a;
#endif
}